

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce.c
# Opt level: O2

int SimulationInit(uchar isPilot,uint nThreads,unsigned_long nEvents,unsigned_long firstEvent,
                  char *userOpts,void **simContext)

{
  void *pvVar1;
  int iVar2;
  undefined7 in_register_00000039;
  
  iVar2 = -1;
  if ((int)CONCAT71(in_register_00000039,isPilot) == 0) {
    pvVar1 = calloc(1,0x10);
    if (pvVar1 != (void *)0x0) {
      *simContext = pvVar1;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int SimulationInit(unsigned char isPilot, unsigned int nThreads, unsigned long nEvents, unsigned long firstEvent, const char * userOpts, void ** simContext)
{
    TContext * context;

    UNUSED_PARAMETER(nThreads);
    UNUSED_PARAMETER(nEvents);
    UNUSED_PARAMETER(firstEvent);
    UNUSED_PARAMETER(userOpts);

    /* Check we're running in the context we where built for */
#ifdef USE_PILOT_THREAD
    if (!isPilot)
        return -1;
#else
    if (isPilot)
        return -1;
#endif

    /* Allocate our own context */
    context = malloc(sizeof(TContext));
    if (context == NULL)
    {
        return -1;
    }

    /* Init it */
    context->fTotal = 0.;
    context->fInside = 0.;

    /* And return it */
    *simContext = context;

    return 0;
}